

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz_red.c
# Opt level: O0

void zzRedMont_fast(word *a,word *mod,size_t n,word mont_param,void *stack)

{
  long lVar1;
  int iVar2;
  word wVar3;
  long in_RCX;
  word *in_RDX;
  word *in_RSI;
  word *in_RDI;
  size_t i;
  word w;
  word carry;
  size_t in_stack_ffffffffffffffb8;
  word *b;
  word in_stack_ffffffffffffffc8;
  word *a_00;
  
  a_00 = (word *)0x0;
  for (b = (word *)0x0; b < in_RDX; b = (word *)((long)b + 1)) {
    in_stack_ffffffffffffffc8 = in_RDI[(long)b] * in_RCX;
    lVar1 = (long)b + (long)in_RDX;
    in_stack_ffffffffffffffb8 = (long)in_RDX - (long)b;
    wVar3 = zzAddMulW(in_RDI + (long)b,in_RSI,(size_t)in_RDX,in_stack_ffffffffffffffc8);
    wVar3 = zzAddW2(in_RDI + lVar1,in_stack_ffffffffffffffb8,wVar3);
    a_00 = (word *)(wVar3 | (ulong)a_00);
  }
  wwCopy(in_RDI,in_RDI + (long)in_RDX,(size_t)in_RDX);
  in_RDI[(long)in_RDX] = (word)a_00;
  iVar2 = wwCmp2(a_00,in_stack_ffffffffffffffc8,b,in_stack_ffffffffffffffb8);
  if (-1 < iVar2) {
    zzSub2(in_RDI,in_RSI,(size_t)in_RDX);
  }
  return;
}

Assistant:

void FAST(zzRedMont)(word a[], const word mod[], size_t n, 
	register word mont_param, void* stack)
{
	register word carry = 0;
	register word w;
	size_t i;
	// pre
	ASSERT(wwIsDisjoint2(a, 2 * n, mod, n));
	ASSERT(n > 0 && mod[n - 1] != 0 && mod[0] % 2);
	ASSERT((word)(mod[0] * mont_param + 1) == 0);
	// редукция в редакции Дуссе -- Калиски
	for (i = 0; i < n; ++i)
	{
		zzMul11Lo(w, a[i], mont_param);
		carry |= zzAddW2(a + i + n, n - i, zzAddMulW(a + i, mod, n, w));
	}
	ASSERT(wwIsZero(a, n));
	// a <- a / B^n
	wwCopy(a, a + n, n);
	a[n] = carry;
	// a >= mod?
	if (wwCmp2(a, n + 1, mod, n) >= 0)
		// a <- a - mod
		zzSub2(a, mod, n);
	// очистка
	carry = w = 0;
}